

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O0

void __thiscall spvtools::opt::RegisterLiveness::Analyze(RegisterLiveness *this,Function *f)

{
  ComputeRegisterLiveness local_50;
  Function *local_18;
  Function *f_local;
  RegisterLiveness *this_local;
  
  local_18 = f;
  f_local = (Function *)this;
  std::
  unordered_map<unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>_>_>
  ::clear(&this->block_pressure_);
  anon_unknown_8::ComputeRegisterLiveness::ComputeRegisterLiveness(&local_50,this,local_18);
  anon_unknown_8::ComputeRegisterLiveness::Compute(&local_50);
  return;
}

Assistant:

void RegisterLiveness::Analyze(Function* f) {
  block_pressure_.clear();
  ComputeRegisterLiveness(this, f).Compute();
}